

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O3

void VP8LInitBitReader(VP8LBitReader *br,uint8_t *start,size_t length)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  byte *pbVar4;
  
  br->len = length;
  uVar3 = 0;
  br->val = 0;
  br->bit_pos = 0;
  br->eos = 0;
  sVar1 = 8;
  if (length < 8) {
    sVar1 = length;
  }
  if (length != 0) {
    lVar2 = 0;
    uVar3 = 0;
    pbVar4 = start;
    do {
      uVar3 = uVar3 | (ulong)*pbVar4 << ((byte)lVar2 & 0x3f);
      lVar2 = lVar2 + 8;
      pbVar4 = pbVar4 + 1;
    } while (sVar1 * 8 - lVar2 != 0);
  }
  br->val = uVar3;
  br->pos = sVar1;
  br->buf = start;
  return;
}

Assistant:

void VP8LInitBitReader(VP8LBitReader* const br, const uint8_t* const start,
                       size_t length) {
  size_t i;
  vp8l_val_t value = 0;
  assert(br != NULL);
  assert(start != NULL);
  assert(length < 0xfffffff8u);   // can't happen with a RIFF chunk.

  br->len = length;
  br->val = 0;
  br->bit_pos = 0;
  br->eos = 0;

  if (length > sizeof(br->val)) {
    length = sizeof(br->val);
  }
  for (i = 0; i < length; ++i) {
    value |= (vp8l_val_t)start[i] << (8 * i);
  }
  br->val = value;
  br->pos = length;
  br->buf = start;
}